

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

void __thiscall CEExecOptions::AddJDPar(CEExecOptions *this)

{
  double in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  CLOptions *in_stack_ffffffffffffffb0;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"j,juliandate",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,"Input Julian date",
             (allocator *)&stack0xffffffffffffff9f);
  CEDate::CurrentJD();
  CLOptions::AddDoubleParam
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return;
}

Assistant:

inline
void CEExecOptions::AddJDPar(void)
{
    AddDoubleParam("j,juliandate", "Input Julian date", CEDate::CurrentJD());
}